

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

int mi_reserve_huge_os_pages_at_ex
              (size_t pages,int numa_node,size_t timeout_msecs,_Bool exclusive,
              mi_arena_id_t *arena_id)

{
  mi_memid_t memid_00;
  mi_memid_t memid_01;
  _Bool _Var1;
  void *start;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  size_t hsize;
  mi_memid_t memid;
  size_t pages_reserved;
  size_t local_58;
  anon_union_16_2_8cef793c_for_mem local_50;
  undefined8 local_40;
  size_t local_38;
  
  if (arena_id != (mi_arena_id_t *)0x0) {
    *arena_id = -1;
  }
  if (pages == 0) {
    iVar4 = 0;
  }
  else {
    uVar3 = 0xffffffff;
    if (-1 < numa_node) {
      sVar2 = _mi_numa_node_count;
      if (_mi_numa_node_count == 0) {
        sVar2 = _mi_os_numa_node_count_get();
      }
      uVar3 = (ulong)(uint)numa_node % sVar2;
    }
    local_58 = 0;
    local_38 = 0;
    start = _mi_os_alloc_huge_os_pages
                      (pages,(int)uVar3,timeout_msecs,&local_38,&local_58,(mi_memid_t *)&local_50.os
                      );
    if (local_38 == 0 || start == (void *)0x0) {
      _mi_warning_message("failed to reserve %zu GiB huge pages\n",pages);
    }
    else {
      _mi_verbose_message("numa node %i: reserved %zu GiB huge pages (of the %zu GiB requested)\n",
                          uVar3 & 0xffffffff,local_38,pages);
      memid_00.mem.os.size = local_50.os.size;
      memid_00.mem.os.base = local_50.os.base;
      memid_00.is_pinned = (_Bool)(undefined1)local_40;
      memid_00.initially_committed = (_Bool)local_40._1_1_;
      memid_00.initially_zero = (_Bool)local_40._2_1_;
      memid_00._19_1_ = local_40._3_1_;
      memid_00.memkind = local_40._4_4_;
      _Var1 = mi_manage_os_memory_ex2(start,local_58,true,(int)uVar3,exclusive,memid_00,arena_id);
      if (_Var1) {
        return 0;
      }
      memid_01.mem.os.size = local_50.os.size;
      memid_01.mem.os.base = local_50.os.base;
      memid_01.is_pinned = (_Bool)(undefined1)local_40;
      memid_01.initially_committed = (_Bool)local_40._1_1_;
      memid_01.initially_zero = (_Bool)local_40._2_1_;
      memid_01._19_1_ = local_40._3_1_;
      memid_01.memkind = local_40._4_4_;
      _mi_os_free(start,local_58,memid_01);
    }
    iVar4 = 0xc;
  }
  return iVar4;
}

Assistant:

int mi_reserve_huge_os_pages_at_ex(size_t pages, int numa_node, size_t timeout_msecs, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  if (arena_id != NULL) *arena_id = -1;
  if (pages==0) return 0;
  if (numa_node < -1) numa_node = -1;
  if (numa_node >= 0) numa_node = numa_node % _mi_os_numa_node_count();
  size_t hsize = 0;
  size_t pages_reserved = 0;
  mi_memid_t memid;
  void* p = _mi_os_alloc_huge_os_pages(pages, numa_node, timeout_msecs, &pages_reserved, &hsize, &memid);
  if (p==NULL || pages_reserved==0) {
    _mi_warning_message("failed to reserve %zu GiB huge pages\n", pages);
    return ENOMEM;
  }
  _mi_verbose_message("numa node %i: reserved %zu GiB huge pages (of the %zu GiB requested)\n", numa_node, pages_reserved, pages);

  if (!mi_manage_os_memory_ex2(p, hsize, true, numa_node, exclusive, memid, arena_id)) {
    _mi_os_free(p, hsize, memid);
    return ENOMEM;
  }
  return 0;
}